

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.cc
# Opt level: O0

size_t __thiscall
CoreML::Specification::SupportVectorClassifier::ByteSizeLong(SupportVectorClassifier *this)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  SupportVectorsCase SVar4;
  ClassLabelsCase CVar5;
  size_t sVar6;
  size_t sVar7;
  Coefficients *value;
  int cached_size;
  int cached_size_4;
  size_t data_size_3;
  uint count_3;
  int cached_size_3;
  size_t data_size_2;
  uint count_2;
  int cached_size_2;
  size_t data_size_1;
  uint count_1;
  uint i;
  uint count;
  int cached_size_1;
  size_t data_size;
  size_t total_size;
  SupportVectorClassifier *this_local;
  
  data_size = 0;
  sVar6 = google::protobuf::internal::WireFormatLite::Int32Size
                    (&this->numberofsupportvectorsperclass_);
  if (sVar6 != 0) {
    sVar7 = google::protobuf::internal::WireFormatLite::Int32Size((int32)sVar6);
    data_size = sVar7 + 1;
  }
  iVar2 = google::protobuf::internal::ToCachedSize(sVar6);
  this->_numberofsupportvectorsperclass_cached_byte_size_ = iVar2;
  uVar3 = coefficients_size(this);
  data_size = (ulong)uVar3 + sVar6 + data_size;
  for (data_size_1._4_4_ = 0; data_size_1._4_4_ < uVar3; data_size_1._4_4_ = data_size_1._4_4_ + 1)
  {
    value = coefficients(this,data_size_1._4_4_);
    sVar6 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::Coefficients>(value);
    data_size = sVar6 + data_size;
  }
  uVar3 = rho_size(this);
  sVar6 = (ulong)uVar3 * 8;
  if ((ulong)uVar3 != 0) {
    sVar7 = google::protobuf::internal::WireFormatLite::Int32Size((int32)sVar6);
    data_size = sVar7 + 1 + data_size;
  }
  iVar2 = google::protobuf::internal::ToCachedSize(sVar6);
  this->_rho_cached_byte_size_ = iVar2;
  data_size = sVar6 + data_size;
  uVar3 = proba_size(this);
  sVar6 = (ulong)uVar3 * 8;
  if ((ulong)uVar3 != 0) {
    sVar7 = google::protobuf::internal::WireFormatLite::Int32Size((int32)sVar6);
    data_size = sVar7 + 1 + data_size;
  }
  iVar2 = google::protobuf::internal::ToCachedSize(sVar6);
  this->_proba_cached_byte_size_ = iVar2;
  data_size = sVar6 + data_size;
  uVar3 = probb_size(this);
  sVar6 = (ulong)uVar3 * 8;
  if ((ulong)uVar3 != 0) {
    sVar7 = google::protobuf::internal::WireFormatLite::Int32Size((int32)sVar6);
    data_size = sVar7 + 1 + data_size;
  }
  iVar2 = google::protobuf::internal::ToCachedSize(sVar6);
  this->_probb_cached_byte_size_ = iVar2;
  data_size = sVar6 + data_size;
  bVar1 = has_kernel(this);
  if (bVar1) {
    sVar6 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::Kernel>(this->kernel_);
    data_size = sVar6 + 1 + data_size;
  }
  SVar4 = supportVectors_case(this);
  if (SVar4 != SUPPORTVECTORS_NOT_SET) {
    if (SVar4 == kSparseSupportVectors) {
      sVar6 = google::protobuf::internal::WireFormatLite::
              MessageSizeNoVirtual<CoreML::Specification::SparseSupportVectors>
                        ((this->supportVectors_).sparsesupportvectors_);
      data_size = sVar6 + 1 + data_size;
    }
    else if (SVar4 == kDenseSupportVectors) {
      sVar6 = google::protobuf::internal::WireFormatLite::
              MessageSizeNoVirtual<CoreML::Specification::DenseSupportVectors>
                        ((this->supportVectors_).densesupportvectors_);
      data_size = sVar6 + 1 + data_size;
    }
  }
  CVar5 = ClassLabels_case(this);
  if (CVar5 != CLASSLABELS_NOT_SET) {
    if (CVar5 == kStringClassLabels) {
      sVar6 = google::protobuf::internal::WireFormatLite::
              MessageSizeNoVirtual<CoreML::Specification::StringVector>
                        ((this->ClassLabels_).stringclasslabels_);
      data_size = sVar6 + 2 + data_size;
    }
    else if (CVar5 == kInt64ClassLabels) {
      sVar6 = google::protobuf::internal::WireFormatLite::
              MessageSizeNoVirtual<CoreML::Specification::Int64Vector>
                        ((this->ClassLabels_).int64classlabels_);
      data_size = sVar6 + 2 + data_size;
    }
  }
  iVar2 = google::protobuf::internal::ToCachedSize(data_size);
  this->_cached_size_ = iVar2;
  return data_size;
}

Assistant:

size_t SupportVectorClassifier::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.SupportVectorClassifier)
  size_t total_size = 0;

  // repeated int32 numberOfSupportVectorsPerClass = 2;
  {
    size_t data_size = ::google::protobuf::internal::WireFormatLite::
      Int32Size(this->numberofsupportvectorsperclass_);
    if (data_size > 0) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _numberofsupportvectorsperclass_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  // repeated .CoreML.Specification.Coefficients coefficients = 5;
  {
    unsigned int count = this->coefficients_size();
    total_size += 1UL * count;
    for (unsigned int i = 0; i < count; i++) {
      total_size +=
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->coefficients(i));
    }
  }

  // repeated double rho = 6;
  {
    unsigned int count = this->rho_size();
    size_t data_size = 8UL * count;
    if (data_size > 0) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _rho_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  // repeated double probA = 7;
  {
    unsigned int count = this->proba_size();
    size_t data_size = 8UL * count;
    if (data_size > 0) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _proba_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  // repeated double probB = 8;
  {
    unsigned int count = this->probb_size();
    size_t data_size = 8UL * count;
    if (data_size > 0) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _probb_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  // .CoreML.Specification.Kernel kernel = 1;
  if (this->has_kernel()) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->kernel_);
  }

  switch (supportVectors_case()) {
    // .CoreML.Specification.SparseSupportVectors sparseSupportVectors = 3;
    case kSparseSupportVectors: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *supportVectors_.sparsesupportvectors_);
      break;
    }
    // .CoreML.Specification.DenseSupportVectors denseSupportVectors = 4;
    case kDenseSupportVectors: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *supportVectors_.densesupportvectors_);
      break;
    }
    case SUPPORTVECTORS_NOT_SET: {
      break;
    }
  }
  switch (ClassLabels_case()) {
    // .CoreML.Specification.StringVector stringClassLabels = 100;
    case kStringClassLabels: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *ClassLabels_.stringclasslabels_);
      break;
    }
    // .CoreML.Specification.Int64Vector int64ClassLabels = 101;
    case kInt64ClassLabels: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *ClassLabels_.int64classlabels_);
      break;
    }
    case CLASSLABELS_NOT_SET: {
      break;
    }
  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}